

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O0

SUNMatrix SUNSparseFromBandMatrix(SUNMatrix Ab,sunrealtype droptol,int sparsetype)

{
  long lVar1;
  long lVar2;
  SUNMatrix p_Var3;
  long lVar4;
  int in_ESI;
  long *in_RDI;
  double in_XMM0_Qa;
  SUNMatrix As;
  sunindextype N;
  sunindextype M;
  sunindextype nnz;
  sunindextype j;
  sunindextype i;
  SUNContext_conflict sunctx_local_scope_;
  long local_98;
  long local_88;
  SUNContext_conflict in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  sunindextype in_stack_ffffffffffffff90;
  long in_stack_ffffffffffffff98;
  long in_stack_ffffffffffffffa0;
  long local_58;
  long local_38;
  long local_30;
  long local_28;
  
  lVar1 = *(long *)*in_RDI;
  lVar2 = *(long *)(*in_RDI + 8);
  for (local_30 = 0; local_30 < lVar2; local_30 = local_30 + 1) {
    if (local_30 - *(long *)(*in_RDI + 0x18) < 0) {
      local_58 = 0;
    }
    else {
      local_58 = local_30 - *(long *)(*in_RDI + 0x18);
    }
    local_28 = local_58;
    while( true ) {
      if (lVar1 + -1 < local_30 + *(long *)(*in_RDI + 0x20)) {
        in_stack_ffffffffffffff98 = lVar1 + -1;
      }
      else {
        in_stack_ffffffffffffff98 = local_30 + *(long *)(*in_RDI + 0x20);
      }
      if (in_stack_ffffffffffffff98 < local_28) break;
      local_28 = local_28 + 1;
    }
    in_stack_ffffffffffffffa0 = local_28;
  }
  p_Var3 = SUNSparseMatrix(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                           in_stack_ffffffffffffff90,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20)
                           ,in_stack_ffffffffffffff80);
  local_38 = 0;
  if (in_ESI == 0) {
    for (local_30 = 0; local_30 < lVar2; local_30 = local_30 + 1) {
      *(long *)(*(long *)((long)p_Var3->content + 0x38) + local_30 * 8) = local_38;
      if (local_30 - *(long *)(*in_RDI + 0x18) < 0) {
        local_28 = 0;
      }
      else {
        local_28 = local_30 - *(long *)(*in_RDI + 0x18);
      }
      while( true ) {
        if (lVar1 + -1 < local_30 + *(long *)(*in_RDI + 0x20)) {
          lVar4 = lVar1 + -1;
        }
        else {
          lVar4 = local_30 + *(long *)(*in_RDI + 0x20);
        }
        if (lVar4 < local_28) break;
        if (in_XMM0_Qa <
            ABS(*(double *)
                 (*(long *)(*(long *)(*in_RDI + 0x40) + local_30 * 8) +
                 ((local_28 - local_30) + *(long *)(*in_RDI + 0x28)) * 8))) {
          *(long *)(*(long *)((long)p_Var3->content + 0x30) + local_38 * 8) = local_28;
          *(undefined8 *)(*(long *)((long)p_Var3->content + 0x20) + local_38 * 8) =
               *(undefined8 *)
                (*(long *)(*(long *)(*in_RDI + 0x40) + local_30 * 8) +
                ((local_28 - local_30) + *(long *)(*in_RDI + 0x28)) * 8);
          local_38 = local_38 + 1;
        }
        local_28 = local_28 + 1;
      }
    }
    *(long *)(*(long *)((long)p_Var3->content + 0x38) + lVar2 * 8) = local_38;
  }
  else {
    for (local_28 = 0; local_28 < lVar1; local_28 = local_28 + 1) {
      *(long *)(*(long *)((long)p_Var3->content + 0x38) + local_28 * 8) = local_38;
      if (local_28 - *(long *)(*in_RDI + 0x20) < 0) {
        local_88 = 0;
      }
      else {
        local_88 = local_28 - *(long *)(*in_RDI + 0x20);
      }
      local_30 = local_88;
      while( true ) {
        if (lVar2 + -1 < local_28 + *(long *)(*in_RDI + 0x18)) {
          local_98 = lVar2 + -1;
        }
        else {
          local_98 = local_28 + *(long *)(*in_RDI + 0x18);
        }
        if (local_98 < local_30) break;
        if (in_XMM0_Qa <
            ABS(*(double *)
                 (*(long *)(*(long *)(*in_RDI + 0x40) + local_30 * 8) +
                 ((local_28 - local_30) + *(long *)(*in_RDI + 0x28)) * 8))) {
          *(long *)(*(long *)((long)p_Var3->content + 0x30) + local_38 * 8) = local_30;
          *(undefined8 *)(*(long *)((long)p_Var3->content + 0x20) + local_38 * 8) =
               *(undefined8 *)
                (*(long *)(*(long *)(*in_RDI + 0x40) + local_30 * 8) +
                ((local_28 - local_30) + *(long *)(*in_RDI + 0x28)) * 8);
          local_38 = local_38 + 1;
        }
        local_30 = local_30 + 1;
      }
    }
    *(long *)(*(long *)((long)p_Var3->content + 0x38) + lVar1 * 8) = local_38;
  }
  return p_Var3;
}

Assistant:

SUNMatrix SUNSparseFromBandMatrix(SUNMatrix Ab, sunrealtype droptol,
                                  int sparsetype)
{
  SUNFunctionBegin(Ab->sunctx);
  sunindextype i, j, nnz;
  sunindextype M, N;
  SUNMatrix As;

  SUNAssertNull(SUNMatGetID(Ab) == SUNMATRIX_BAND, SUN_ERR_ARG_WRONGTYPE);
  SUNAssertNull(sparsetype == CSC_MAT || sparsetype == CSR_MAT,
                SUN_ERR_ARG_OUTOFRANGE);
  SUNAssertNull(droptol >= ZERO, SUN_ERR_ARG_OUTOFRANGE);

  /* set size of new matrix */
  M = SM_ROWS_B(Ab);
  N = SM_COLUMNS_B(Ab);

  /* determine total number of nonzeros */
  nnz = 0;
  for (j = 0; j < N; j++)
  {
    for (i = SUNMAX(0, j - SM_UBAND_B(Ab));
         i <= SUNMIN(M - 1, j + SM_LBAND_B(Ab)); i++)
    {
      nnz += (SUNRabs(SM_ELEMENT_B(Ab, i, j)) > droptol);
    }
  }

  /* allocate sparse matrix */
  As = SUNSparseMatrix(M, N, nnz, sparsetype, Ab->sunctx);
  SUNCheckLastErrNull();

  /* copy nonzeros from Ab into As, based on CSR/CSC type */
  nnz = 0;
  if (sparsetype == CSC_MAT)
  {
    for (j = 0; j < N; j++)
    {
      (SM_INDEXPTRS_S(As))[j] = nnz;
      for (i = SUNMAX(0, j - SM_UBAND_B(Ab));
           i <= SUNMIN(M - 1, j + SM_LBAND_B(Ab)); i++)
      {
        if (SUNRabs(SM_ELEMENT_B(Ab, i, j)) > droptol)
        {
          (SM_INDEXVALS_S(As))[nnz] = i;
          (SM_DATA_S(As))[nnz++]    = SM_ELEMENT_B(Ab, i, j);
        }
      }
    }
    (SM_INDEXPTRS_S(As))[N] = nnz;
  }
  else
  { /* CSR_MAT */
    for (i = 0; i < M; i++)
    {
      (SM_INDEXPTRS_S(As))[i] = nnz;
      for (j = SUNMAX(0, i - SM_LBAND_B(Ab));
           j <= SUNMIN(N - 1, i + SM_UBAND_B(Ab)); j++)
      {
        if (SUNRabs(SM_ELEMENT_B(Ab, i, j)) > droptol)
        {
          (SM_INDEXVALS_S(As))[nnz] = j;
          (SM_DATA_S(As))[nnz++]    = SM_ELEMENT_B(Ab, i, j);
        }
      }
    }
    (SM_INDEXPTRS_S(As))[M] = nnz;
  }

  return (As);
}